

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.hpp
# Opt level: O3

size_t io::
       read_all<io::read_only<io::basic_string_stream<char,std::char_traits<char>>>,io::net::dynamic_string_buffer<char,std::char_traits<char>,std::allocator<char>>,void>
                 (read_only<io::basic_string_stream<char,_std::char_traits<char>_>_> *stream,
                 dynamic_string_buffer<char,_std::char_traits<char>,_std::allocator<char>_> *b)

{
  size_t sVar1;
  system_error *this;
  error_code __ec;
  error_code ec;
  error_code local_28;
  
  local_28._M_value = 0;
  local_28._M_cat = (error_category *)std::_V2::system_category();
  sVar1 = read_all<io::read_only<io::basic_string_stream<char,std::char_traits<char>>>,io::net::dynamic_string_buffer<char,std::char_traits<char>,std::allocator<char>>,void>
                    (stream,b,&local_28);
  if (local_28._M_value == 0) {
    return sVar1;
  }
  this = (system_error *)__cxa_allocate_exception(0x20);
  __ec._4_4_ = 0;
  __ec._M_value = local_28._M_value;
  __ec._M_cat = local_28._M_cat;
  std::system_error::system_error(this,__ec);
  __cxa_throw(this,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

std::size_t read_all(SyncReadStream& stream, DynamicBuffer&& b)
{
    std::error_code ec;
    std::size_t bytes_read = io::read_all(stream, std::forward<DynamicBuffer>(b), ec);
    if (ec) {
        throw std::system_error{ec};
    }
    return bytes_read;
}